

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lfunc.c
# Opt level: O2

char * luaF_getlocalname(Proto *f,int param_2,int pc,ravi_type_map *type,TString **usertype)

{
  LocVar *pLVar1;
  long lVar2;
  char *pcVar3;
  
  for (lVar2 = 0;
      ((ulong)(uint)(~(f->sizelocvars >> 0x1f) & f->sizelocvars) << 5 != lVar2 &&
      (pLVar1 = f->locvars, *(int *)((long)&pLVar1->startpc + lVar2) <= pc)); lVar2 = lVar2 + 0x20)
  {
    if (pc < *(int *)((long)&pLVar1->endpc + lVar2)) {
      param_2 = param_2 + -1;
      if (param_2 == 0) {
        *type = *(ravi_type_map *)((long)&pLVar1->ravi_type_map + lVar2);
        *usertype = *(TString **)((long)&pLVar1->usertype + lVar2);
        lVar2 = *(long *)((long)&f->locvars->varname + lVar2);
        pcVar3 = (char *)(lVar2 + 0x18);
        if (lVar2 == 0) {
          pcVar3 = (char *)0x0;
        }
        return pcVar3;
      }
    }
  }
  *type = 0xffffffff;
  *usertype = (TString *)0x0;
  return (char *)0x0;
}

Assistant:

const char *luaF_getlocalname (const Proto *f, int local_number, int pc, ravi_type_map *type, TString **usertype) {
  int i;
  for (i = 0; i<f->sizelocvars && f->locvars[i].startpc <= pc; i++) {
    if (pc < f->locvars[i].endpc) {  /* is variable active? */
      local_number--;
      if (local_number == 0) {
        *type = f->locvars[i].ravi_type_map;
        *usertype = f->locvars[i].usertype;
        if (f->locvars[i].varname == NULL)
          return NULL;
        return getstr(f->locvars[i].varname);
      }
    }
  }
  *type = RAVI_TM_ANY;
  *usertype = NULL;
  return NULL;  /* not found */
}